

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

void lyplg_ext_compile_log_path
               (char *path,lysc_ext_instance *ext,LY_LOG_LEVEL level,LY_ERR err,char *format,...)

{
  char in_AL;
  char *schema_path;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined1 local_d8 [40];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_b0 = in_R9;
  if (path == (char *)0x0) {
    schema_path = (char *)0x0;
  }
  else {
    schema_path = strdup(path);
    if (schema_path == (char *)0x0) {
      ly_log(ext->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lyplg_ext_compile_log_path");
      return;
    }
  }
  ap[0].reg_save_area = local_d8;
  ap[0].overflow_arg_area = &stack0x00000008;
  ap[0].gp_offset = 0x28;
  ap[0].fp_offset = 0x30;
  ly_ext_log(ext->module->ctx,ext->def->plugin->id,level,err,(char *)0x0,schema_path,0,format,ap);
  return;
}

Assistant:

LIBYANG_API_DEF void
lyplg_ext_compile_log_path(const char *path, const struct lysc_ext_instance *ext, LY_LOG_LEVEL level, LY_ERR err,
        const char *format, ...)
{
    va_list ap;
    char *schema_path = NULL;

    if (path && !(schema_path = strdup(path))) {
        LOGMEM(ext->module->ctx);
        return;
    }

    va_start(ap, format);
    ly_ext_log(ext->module->ctx, ext->def->plugin->id, level, err, NULL, schema_path, 0, format, ap);
    va_end(ap);
}